

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  void *pvVar1;
  params *ppVar2;
  uint8 *puVar3;
  results *prVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  color_quad_u8 *pcVar12;
  byte bVar13;
  long *plVar14;
  short sVar15;
  ulong uVar16;
  uint uVar17;
  ushort uVar18;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long *plVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint64 s;
  uint uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  uint c;
  long lVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  bool bVar37;
  vector<unsigned_int> solutions;
  uint64 hist [4];
  uint64 d [3];
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  color_quad_u8 block_colors [4];
  uint local_1c0;
  uint local_1bc;
  ushort local_1a4;
  ushort local_1a0;
  elemental_vector local_188;
  ulong local_178;
  ulong local_170;
  int local_168;
  uint local_164;
  ulong local_160;
  ulong local_158;
  dxt_endpoint_refiner *local_150;
  long local_148 [8];
  long local_108 [24];
  color_quad_u8 local_48 [6];
  short sVar19;
  
  uVar9 = (uint)(low_color->m_s[0] * 32.0);
  if (0x1e < (int)uVar9) {
    uVar9 = 0x1f;
  }
  uVar20 = 0;
  if ((int)uVar9 < 1) {
    uVar9 = uVar20;
  }
  uVar26 = (uint)(low_color->m_s[1] * 64.0);
  if (0x3e < (int)uVar26) {
    uVar26 = 0x3f;
  }
  uVar35 = 0;
  if ((int)uVar26 < 1) {
    uVar26 = uVar35;
  }
  local_1bc = (uint)(low_color->m_s[2] * 32.0);
  if (0x1e < (int)local_1bc) {
    local_1bc = 0x1f;
  }
  if ((int)local_1bc < 1) {
    local_1bc = uVar20;
  }
  uVar10 = (uint)(high_color->m_s[0] * 32.0);
  local_1bc = local_1bc | uVar26 << 5 | uVar9 << 0xb;
  if (0x1e < (int)uVar10) {
    uVar10 = 0x1f;
  }
  if ((int)uVar10 < 1) {
    uVar10 = uVar20;
  }
  uVar20 = (uint)(high_color->m_s[1] * 64.0);
  uVar9 = 0x3f;
  if ((int)uVar20 < 0x3f) {
    uVar9 = uVar20;
  }
  if ((int)uVar9 < 1) {
    uVar9 = uVar35;
  }
  uVar20 = (uint)(high_color->m_s[2] * 32.0);
  local_1c0 = 0x1f;
  if ((int)uVar20 < 0x1f) {
    local_1c0 = uVar20;
  }
  if ((int)local_1c0 < 1) {
    local_1c0 = uVar35;
  }
  local_1c0 = local_1c0 | uVar9 << 5 | uVar10 << 0xb;
  local_148[2] = 0;
  local_148[3] = 0;
  local_148[0] = 0;
  local_148[1] = 0;
  local_108[0x16] = 0;
  local_108[0x17] = 0;
  local_108[0x14] = 0;
  local_108[0x15] = 0;
  local_108[0x12] = 0;
  local_108[0x13] = 0;
  local_108[0x10] = 0;
  local_108[0x11] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  ppVar2 = this->m_pParams;
  uVar9 = ppVar2->m_num_pixels;
  if ((ulong)uVar9 != 0) {
    pcVar12 = ppVar2->m_pPixels;
    puVar3 = ppVar2->m_pSelectors;
    uVar22 = 0;
    do {
      uVar16 = (ulong)puVar3[uVar22];
      local_148[uVar16] = local_148[uVar16] + 1;
      lVar30 = 0;
      do {
        bVar13 = (pcVar12->field_0).c[lVar30];
        local_108[uVar16 * 3 + lVar30 + 0xc] =
             local_108[uVar16 * 3 + lVar30 + 0xc] + (ulong)((uint)bVar13 * 2);
        local_108[uVar16 * 3 + lVar30] =
             local_108[uVar16 * 3 + lVar30] + (ulong)bVar13 * (ulong)bVar13;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      uVar22 = uVar22 + 1;
      pcVar12 = pcVar12 + 1;
    } while (uVar22 != uVar9);
  }
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_150 = this;
  elemental_vector::increase_capacity(&local_188,0x36,false,4,(object_mover)0x0,false);
  memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
         (ulong)(0x36 - local_188.m_size) << 2);
  local_188.m_size = 0x36;
  local_158 = local_148[2] + local_148[0];
  local_160 = local_148[3] + local_148[1];
  iVar11 = 8;
  do {
    pvVar7 = local_188.m_p;
    uVar9 = local_1bc & 0x1f;
    uVar22 = 0;
    sVar15 = (short)uVar9;
    uVar16 = (ulong)(ushort)(sVar15 - 1);
    if (sVar15 == 0) {
      uVar16 = uVar22;
    }
    uVar20 = local_1bc & 0xffff;
    if ((ushort)uVar16 <= (ushort)(sVar15 + 1U)) {
      uVar26 = uVar20 >> 5 & 0x3f;
      uVar22 = 0;
      sVar15 = (short)uVar26;
      uVar35 = (uint)(ushort)(sVar15 - 1);
      if (sVar15 == 0) {
        uVar35 = 0;
      }
      sVar19 = (short)(uVar20 >> 0xb);
      uVar18 = sVar19 + -1 + (ushort)(uVar20 < 0x800);
      local_170 = CONCAT44(local_170._4_4_,(uint)uVar18);
      uVar28 = ((local_1c0 & 0xffff) * 0x10000 + (uint)uVar18 * 0x800 | uVar35 << 5) + (int)uVar16;
      uVar10 = (uVar35 << 5 | (uint)uVar18 * 0x800) + (int)uVar16;
      iVar24 = uVar20 - uVar10;
      do {
        local_178 = uVar16;
        local_1a4 = (ushort)uVar35;
        uVar29 = uVar28;
        uVar17 = uVar10;
        iVar25 = iVar24;
        uVar34 = uVar35;
        if (local_1a4 <= (ushort)(sVar15 + 1U)) {
          do {
            uVar16 = uVar22;
            uVar21 = (uint)uVar18;
            uVar5 = uVar29;
            uVar6 = uVar17;
            iVar27 = iVar25;
            if (uVar18 < 0x20 && uVar18 <= (ushort)(sVar19 + 1U)) {
              do {
                uVar22 = uVar16;
                if (iVar27 != 0) {
                  uVar33 = uVar5 << 0x10 | uVar5 >> 0x10;
                  if ((local_1c0 & 0xffff) <= uVar6 && uVar6 != (local_1c0 & 0xffff)) {
                    uVar33 = uVar5;
                  }
                  uVar22 = (ulong)((int)uVar16 + 1);
                  *(uint *)((long)local_188.m_p + uVar16 * 4) = uVar33;
                }
                if (uVar20 >> 0xb < uVar21) break;
                bVar36 = uVar21 < 0x1f;
                uVar16 = uVar22;
                uVar21 = uVar21 + 1;
                uVar5 = uVar5 + 0x800;
                uVar6 = uVar6 + 0x800;
                iVar27 = iVar27 + -0x800;
              } while (bVar36);
            }
            if (uVar26 < uVar34) break;
            uVar29 = uVar29 + 0x20;
            iVar25 = iVar25 + -0x20;
            uVar17 = uVar17 + 0x20;
            bVar36 = uVar34 < 0x3f;
            uVar34 = uVar34 + 1;
          } while (bVar36);
        }
        uVar29 = (uint)local_178;
        local_164 = uVar9;
        if (uVar9 < uVar29) break;
        uVar28 = uVar28 + 1;
        iVar24 = iVar24 + -1;
        uVar10 = uVar10 + 1;
        uVar16 = (ulong)(uVar29 + 1);
      } while (uVar29 < 0x1f);
    }
    sVar15 = (short)(local_1c0 & 0x1f);
    uVar16 = (ulong)(ushort)(sVar15 - 1);
    if (sVar15 == 0) {
      uVar16 = 0;
    }
    if ((ushort)uVar16 <= (ushort)(sVar15 + 1U)) {
      uVar35 = local_1c0 & 0xffff;
      uVar26 = uVar35 >> 5 & 0x3f;
      sVar15 = (short)uVar26;
      uVar9 = (uint)(ushort)(sVar15 - 1);
      if (sVar15 == 0) {
        uVar9 = 0;
      }
      sVar19 = (short)(uVar35 >> 0xb);
      uVar18 = sVar19 + -1 + (ushort)(uVar35 < 0x800);
      uVar28 = (uVar20 * 0x10000 + (uint)uVar18 * 0x800 | uVar9 << 5) + (int)uVar16;
      uVar10 = (uVar9 << 5 | (uint)uVar18 * 0x800) + (int)uVar16;
      iVar24 = uVar35 - uVar10;
      do {
        local_170 = uVar16;
        local_178 = CONCAT44(local_178._4_4_,iVar24);
        local_1a0 = (ushort)uVar9;
        uVar29 = uVar28;
        uVar17 = uVar10;
        iVar25 = iVar24;
        uVar34 = uVar9;
        if (local_1a0 <= (ushort)(sVar15 + 1U)) {
          do {
            uVar16 = uVar22;
            uVar21 = (uint)uVar18;
            iVar27 = iVar25;
            uVar5 = uVar17;
            uVar6 = uVar29;
            if (uVar18 < 0x20 && uVar18 <= (ushort)(sVar19 + 1U)) {
              do {
                uVar22 = uVar16;
                if (iVar27 != 0) {
                  uVar33 = uVar6 << 0x10 | uVar6 >> 0x10;
                  if (uVar20 < uVar5) {
                    uVar33 = uVar6;
                  }
                  uVar22 = (ulong)((int)uVar16 + 1);
                  *(uint *)((long)local_188.m_p + uVar16 * 4) = uVar33;
                }
                if (uVar35 >> 0xb < uVar21) break;
                bVar36 = uVar21 < 0x1f;
                uVar16 = uVar22;
                uVar21 = uVar21 + 1;
                iVar27 = iVar27 + -0x800;
                uVar5 = uVar5 + 0x800;
                uVar6 = uVar6 + 0x800;
              } while (bVar36);
            }
            if (uVar26 < uVar34) break;
            uVar29 = uVar29 + 0x20;
            iVar25 = iVar25 + -0x20;
            uVar17 = uVar17 + 0x20;
            bVar36 = uVar34 < 0x3f;
            uVar34 = uVar34 + 1;
          } while (bVar36);
        }
        uVar29 = (uint)local_170;
        if ((local_1c0 & 0x1f) < uVar29) break;
        uVar28 = uVar28 + 1;
        iVar24 = iVar24 + -1;
        uVar10 = uVar10 + 1;
        uVar16 = (ulong)(uVar29 + 1);
      } while (uVar29 < 0x1f);
    }
    local_168 = iVar11;
    if ((int)uVar22 != 0) {
      pvVar1 = (void *)((long)local_188.m_p + uVar22 * 4);
      lVar30 = 0x3f;
      if (uVar22 != 0) {
        for (; uVar22 >> lVar30 == 0; lVar30 = lVar30 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_188.m_p,pvVar1,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar7,pvVar1);
    }
    bVar36 = uVar22 != 0;
    if (uVar22 == 0) {
      bVar13 = 0;
    }
    else {
      uVar16 = 0;
      bVar13 = 0;
      do {
        if ((uVar16 == 0) ||
           (*(int *)((long)local_188.m_p + uVar16 * 4) !=
            *(int *)((long)local_188.m_p + uVar16 * 4 + -4))) {
          uVar9 = *(uint *)((long)local_188.m_p + uVar16 * 4);
          uVar20 = uVar9 >> 0x10;
          if ((uVar9 & 0xffff) == uVar20) {
            if (local_160 < local_158) {
              uVar26 = (uint)((short)uVar9 == 0);
            }
            else {
              uVar35 = ~uVar9;
              uVar26 = 1;
              if (((uVar35 & 0x1f) == 0) && (uVar26 = 0x800, (uVar35 & 0xf800) == 0)) {
                uVar26 = (uint)((uVar35 & 0x7e0) != 0) << 5;
              }
            }
            if (local_160 < local_158) {
              iVar11 = -1;
              if (((uVar9 & 0x1f0000) == 0) && (iVar11 = -0x800, uVar9 < 0x8000000)) {
                iVar11 = (uint)(uVar9 < 0x10000) * 0x20 + -0x20;
              }
            }
            else {
              iVar11 = -(uint)(uVar20 == 0xffff);
            }
            uVar9 = uVar26 + uVar9;
            uVar20 = uVar20 + iVar11;
          }
          pcVar12 = local_48;
          dxt1_block::get_block_colors4(pcVar12,(uint16)uVar9,(uint16)uVar20);
          bVar37 = local_150->m_pParams->m_perceptual;
          plVar14 = local_108 + 0xc;
          plVar23 = local_108;
          lVar30 = 0;
          uVar8 = 0;
          do {
            lVar31 = local_148[lVar30];
            lVar32 = 0;
            do {
              local_148[lVar32 + 4] =
                   (lVar31 * (ulong)(pcVar12->field_0).c[lVar32] - plVar14[lVar32]) *
                   (ulong)(pcVar12->field_0).c[lVar32] + plVar23[lVar32];
              lVar32 = lVar32 + 1;
            } while (lVar32 != 3);
            if (bVar37 == false) {
              lVar31 = local_148[4] + local_148[5];
            }
            else {
              lVar31 = local_148[5] * 0x19 + local_148[4] * 8;
            }
            uVar8 = uVar8 + lVar31 + local_148[6];
            lVar30 = lVar30 + 1;
            pcVar12 = pcVar12 + 1;
            plVar23 = plVar23 + 3;
            plVar14 = plVar14 + 3;
          } while (lVar30 != 4);
          prVar4 = local_150->m_pResults;
          bVar37 = true;
          if (uVar8 < prVar4->m_error) {
            prVar4->m_low_color = (uint16)uVar9;
            prVar4->m_high_color = (uint16)uVar20;
            prVar4->m_error = uVar8;
            bVar37 = uVar8 != 0;
            local_1bc = uVar9;
            local_1c0 = uVar20;
            if (bVar37) {
              bVar13 = 1;
            }
          }
          if (!bVar37) break;
        }
        uVar16 = uVar16 + 1;
        bVar36 = uVar16 < uVar22;
      } while (uVar16 != uVar22);
    }
    if ((bVar36) || (iVar11 = local_168 + -1, !(bool)(bVar13 & iVar11 != 0))) {
      if (local_188.m_p != (void *)0x0) {
        crnlib_free(local_188.m_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color)
    {
        uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
        uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

        uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            const color_quad_u8& pixel = m_pParams->m_pPixels[i];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            for (uint c = 0; c < 3; c++)
            {
                D2[s][c] += pixel[c] * 2;
                DD[s][c] += pixel[c] * pixel[c];
            }
        }
        crnlib::vector<uint> solutions(54);
        bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
        bool improved = true;

        for (uint iterations = 8; improved && iterations; iterations--)
        {
            improved = false;
            uint solutions_count = 0;
            for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 L = r << 11 | g << 5 | b;
                        if (L != L0)
                        {
                            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
                        }
                    }
                }
            }
            for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 H = r << 11 | g << 5 | b;
                        if (H != H0)
                        {
                            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
                        }
                    }
                }
            }
            std::sort(solutions.begin(), solutions.begin() + solutions_count);
            for (uint i = 0; i < solutions_count; i++)
            {
                if (i && solutions[i] == solutions[i - 1])
                {
                    continue;
                }
                uint16 L = solutions[i] & 0xFFFF;
                uint16 H = solutions[i] >> 16;
                if (L == H)
                {
                    L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800
                            : ~L & 0x7E0                            ? 0x20
                                                                    : 0
                        : !L        ? 0x1
                                    : 0;
                    H -= preserveL    ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800
                               : H & 0x7E0                          ? 0x20
                                                                    : 0
                        : H == 0xFFFF ? 0x1
                                      : 0;
                }
                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors4(block_colors, L, H);
                uint64 error = 0;
                for (uint64 s = 0, d[3]; s < 4; s++)
                {
                    for (uint c = 0; c < 3; c++)
                    {
                        d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
                    }
                    error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
                }
                if (error < m_pResults->m_error)
                {
                    m_pResults->m_low_color = L0 = L;
                    m_pResults->m_high_color = H0 = H;
                    m_pResults->m_error = error;
                    if (!m_pResults->m_error)
                    {
                        return;
                    }
                    improved = true;
                }
            }
        }
    }